

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

CustomLayerParams_ParametersEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse>
          (Arena *arena)

{
  CustomLayerParams_ParametersEntry_DoNotUse *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomLayerParams_ParametersEntry_DoNotUse *)operator_new(0x28);
    CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse::
    CustomLayerParams_ParametersEntry_DoNotUse(this,(Arena *)0x0);
  }
  else {
    this = (CustomLayerParams_ParametersEntry_DoNotUse *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse::typeinfo);
    CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse::
    CustomLayerParams_ParametersEntry_DoNotUse(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }